

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O3

void av1_convolve_2d_scale_c
               (uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int subpel_x_qn,int x_step_qn,int subpel_y_qn,int y_step_qn,
               ConvolveParams *conv_params)

{
  ushort uVar1;
  ushort uVar2;
  int16_t *piVar3;
  CONV_BUF_TYPE *pCVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  int iVar11;
  ulong uVar12;
  undefined2 *puVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  short *psVar17;
  uint uVar18;
  uint8_t *puVar19;
  long lVar20;
  ulong uVar21;
  ulong uStack_10c90;
  ulong uStack_10c88;
  undefined2 auStack_10c38 [34308];
  
  iVar5 = (h + -1) * y_step_qn + subpel_y_qn >> 10;
  uVar1 = filter_params_y->taps;
  iVar11 = (uVar1 >> 1) - 1;
  uVar12 = (ulong)(uint)w;
  uVar6 = iVar5 + (uint)uVar1;
  bVar9 = (byte)conv_params->round_0;
  if (uVar6 != 0 && SCARRY4(iVar5,(uint)uVar1) == (int)uVar6 < 0) {
    uVar2 = filter_params_x->taps;
    puVar19 = src + (1 - ((ulong)(uVar2 >> 1) + (long)(iVar11 * src_stride)));
    uStack_10c90 = 0;
    do {
      if (0 < w) {
        piVar3 = filter_params_x->filter_ptr;
        uVar7 = 0;
        uVar14 = subpel_x_qn;
        do {
          if ((ulong)uVar2 == 0) {
            iVar5 = 0x4000;
          }
          else {
            iVar5 = 0x4000;
            uVar21 = 0;
            do {
              iVar5 = iVar5 + (uint)puVar19[uVar21 + (long)((int)uVar14 >> 10)] *
                              (int)piVar3[(uVar14 >> 6 & 0xf) * (uint)uVar2 + uVar21];
              uVar21 = uVar21 + 1;
            } while (uVar2 != uVar21);
          }
          auStack_10c38[uVar7 + uStack_10c90 * uVar12] =
               (short)(iVar5 + ((1 << (bVar9 & 0x1f)) >> 1) >> (bVar9 & 0x1f));
          uVar7 = uVar7 + 1;
          uVar14 = uVar14 + x_step_qn;
        } while (uVar7 != uVar12);
      }
      uStack_10c90 = uStack_10c90 + 1;
      puVar19 = puVar19 + src_stride;
    } while (uStack_10c90 != uVar6);
  }
  if (0 < w) {
    bVar8 = 0xe - ((char)conv_params->round_1 + bVar9);
    pCVar4 = conv_params->dst;
    iVar5 = conv_params->dst_stride;
    bVar9 = 0x16 - bVar9;
    iVar15 = 1 << (bVar9 & 0x1f);
    iVar16 = (1 << (bVar8 & 0x1f)) >> 1;
    puVar13 = auStack_10c38 + (1 - (ulong)(uVar1 >> 1)) * uVar12 + (long)(iVar11 * w);
    uStack_10c88 = 0;
    do {
      if (0 < h) {
        uVar7 = 0;
        uVar6 = subpel_y_qn;
        do {
          uVar1 = filter_params_y->taps;
          iVar11 = iVar15;
          if (uVar1 != 0) {
            psVar17 = puVar13 + ((int)uVar6 >> 10) * w;
            uVar21 = 0;
            do {
              iVar11 = iVar11 + (int)*psVar17 *
                                (int)filter_params_y->filter_ptr
                                     [(uVar6 >> 6 & 0xf) * (uint)uVar1 + uVar21];
              uVar21 = uVar21 + 1;
              psVar17 = psVar17 + uVar12;
            } while (uVar1 != uVar21);
          }
          bVar10 = (byte)conv_params->round_1;
          uVar14 = ((1 << (bVar10 & 0x1f)) >> 1) + iVar11 >> (bVar10 & 0x1f);
          if (conv_params->is_compound == 0) {
            iVar11 = (-1 << (bVar9 - bVar10 & 0x1f)) + iVar16 +
                     (-1 << ((bVar9 - bVar10) - 1 & 0x1f)) + (uVar14 & 0xffff);
LAB_00391080:
            iVar11 = iVar11 >> (bVar8 & 0x1f);
            if (iVar11 < 1) {
              iVar11 = 0;
            }
            if (0xfe < iVar11) {
              iVar11 = 0xff;
            }
            dst[uVar7 * (long)dst_stride + uStack_10c88] = (uint8_t)iVar11;
          }
          else {
            lVar20 = uVar7 * (long)iVar5;
            if (conv_params->do_average != 0) {
              uVar18 = (uint)pCVar4[uStack_10c88 + lVar20];
              if (conv_params->use_dist_wtd_comp_avg == 0) {
                uVar14 = (uVar14 & 0xffff) + uVar18 >> 1;
              }
              else {
                uVar14 = (int)((uVar14 & 0xffff) * conv_params->bck_offset +
                              uVar18 * conv_params->fwd_offset) >> 4;
              }
              iVar11 = (-1 << (bVar9 - bVar10 & 0x1f)) + iVar16 +
                       (-1 << ((bVar9 - bVar10) - 1 & 0x1f)) + uVar14;
              goto LAB_00391080;
            }
            pCVar4[uStack_10c88 + lVar20] = (CONV_BUF_TYPE)uVar14;
          }
          uVar7 = uVar7 + 1;
          uVar6 = uVar6 + y_step_qn;
        } while (uVar7 != (uint)h);
      }
      uStack_10c88 = uStack_10c88 + 1;
      puVar13 = puVar13 + 1;
    } while (uStack_10c88 != uVar12);
  }
  return;
}

Assistant:

void av1_convolve_2d_scale_c(const uint8_t *src, int src_stride, uint8_t *dst,
                             int dst_stride, int w, int h,
                             const InterpFilterParams *filter_params_x,
                             const InterpFilterParams *filter_params_y,
                             const int subpel_x_qn, const int x_step_qn,
                             const int subpel_y_qn, const int y_step_qn,
                             ConvolveParams *conv_params) {
  int16_t im_block[(2 * MAX_SB_SIZE + MAX_FILTER_TAP) * MAX_SB_SIZE];
  int im_h = (((h - 1) * y_step_qn + subpel_y_qn) >> SCALE_SUBPEL_BITS) +
             filter_params_y->taps;
  CONV_BUF_TYPE *dst16 = conv_params->dst;
  const int dst16_stride = conv_params->dst_stride;
  const int bits =
      FILTER_BITS * 2 - conv_params->round_0 - conv_params->round_1;
  assert(bits >= 0);
  int im_stride = w;
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const int bd = 8;

  // horizontal filter
  const uint8_t *src_horiz = src - fo_vert * src_stride;
  for (int y = 0; y < im_h; ++y) {
    int x_qn = subpel_x_qn;
    for (int x = 0; x < w; ++x, x_qn += x_step_qn) {
      const uint8_t *const src_x = &src_horiz[(x_qn >> SCALE_SUBPEL_BITS)];
      const int x_filter_idx = (x_qn & SCALE_SUBPEL_MASK) >> SCALE_EXTRA_BITS;
      assert(x_filter_idx < SUBPEL_SHIFTS);
      const int16_t *x_filter =
          av1_get_interp_filter_subpel_kernel(filter_params_x, x_filter_idx);
      int32_t sum = (1 << (bd + FILTER_BITS - 1));
      for (int k = 0; k < filter_params_x->taps; ++k) {
        sum += x_filter[k] * src_x[k - fo_horiz];
      }
      assert(filter_params_x->taps > 8 ||
             (0 <= sum && sum < (1 << (bd + FILTER_BITS + 1))));
      im_block[y * im_stride + x] =
          (int16_t)ROUND_POWER_OF_TWO(sum, conv_params->round_0);
    }
    src_horiz += src_stride;
  }

  // vertical filter
  int16_t *src_vert = im_block + fo_vert * im_stride;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  for (int x = 0; x < w; ++x) {
    int y_qn = subpel_y_qn;
    for (int y = 0; y < h; ++y, y_qn += y_step_qn) {
      const int16_t *src_y = &src_vert[(y_qn >> SCALE_SUBPEL_BITS) * im_stride];
      const int y_filter_idx = (y_qn & SCALE_SUBPEL_MASK) >> SCALE_EXTRA_BITS;
      assert(y_filter_idx < SUBPEL_SHIFTS);
      const int16_t *y_filter =
          av1_get_interp_filter_subpel_kernel(filter_params_y, y_filter_idx);
      int32_t sum = 1 << offset_bits;
      for (int k = 0; k < filter_params_y->taps; ++k) {
        sum += y_filter[k] * src_y[(k - fo_vert) * im_stride];
      }
      assert(filter_params_y->taps > 8 ||
             (0 <= sum && sum < (1 << (offset_bits + 2))));
      CONV_BUF_TYPE res = ROUND_POWER_OF_TWO(sum, conv_params->round_1);
      if (conv_params->is_compound) {
        if (conv_params->do_average) {
          int32_t tmp = dst16[y * dst16_stride + x];
          if (conv_params->use_dist_wtd_comp_avg) {
            tmp = tmp * conv_params->fwd_offset + res * conv_params->bck_offset;
            tmp = tmp >> DIST_PRECISION_BITS;
          } else {
            tmp += res;
            tmp = tmp >> 1;
          }
          /* Subtract round offset and convolve round */
          tmp = tmp - ((1 << (offset_bits - conv_params->round_1)) +
                       (1 << (offset_bits - conv_params->round_1 - 1)));
          dst[y * dst_stride + x] = clip_pixel(ROUND_POWER_OF_TWO(tmp, bits));
        } else {
          dst16[y * dst16_stride + x] = res;
        }
      } else {
        /* Subtract round offset and convolve round */
        int32_t tmp = res - ((1 << (offset_bits - conv_params->round_1)) +
                             (1 << (offset_bits - conv_params->round_1 - 1)));
        dst[y * dst_stride + x] = clip_pixel(ROUND_POWER_OF_TWO(tmp, bits));
      }
    }
    src_vert++;
  }
}